

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O2

int Unr_ManFanin0Value(Unr_Man_t *p,Unr_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Unr_Obj_t *pUVar3;
  uint uVar4;
  uint uVar5;
  char *__assertion;
  
  pUVar3 = Unr_ManObj(p,pObj->hFan0);
  uVar1 = (uint)((ulong)*(undefined8 *)&pUVar3->field_0x8 >> 0x20);
  uVar5 = uVar1 >> 2 & 0x7fff;
  uVar1 = uVar1 >> 0x11;
  if (uVar1 < uVar5) {
    uVar4 = *(uint *)&pObj->field_0x8 >> 2 & 0x7fff;
    if (uVar4 < uVar5) {
      iVar2 = Abc_LitNotCond(pUVar3->Res[(int)((uVar1 + uVar5) - uVar4) % (int)uVar5],
                             *(uint *)&pObj->field_0x8 & 1);
      return iVar2;
    }
    __assertion = "pObj->uRDiff0 < pFanin->RankMax";
    uVar1 = 0x4d;
  }
  else {
    __assertion = "pFanin->RankCur < pFanin->RankMax";
    uVar1 = 0x4c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                ,uVar1,"int Unr_ManFanin0Value(Unr_Man_t *, Unr_Obj_t *)");
}

Assistant:

static inline int Unr_ManFanin0Value( Unr_Man_t * p, Unr_Obj_t * pObj )
{
    Unr_Obj_t * pFanin = Unr_ManObj( p, pObj->hFan0 );
    int Index = (pFanin->RankCur + pFanin->RankMax - pObj->uRDiff0) % pFanin->RankMax;
    assert( pFanin->RankCur < pFanin->RankMax );
    assert( pObj->uRDiff0 < pFanin->RankMax );
    return Abc_LitNotCond( pFanin->Res[Index], pObj->fCompl0 );
}